

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::OrientedDiscMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [16];
  float fVar56;
  undefined1 auVar53 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [64];
  undefined1 auVar65 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  Primitive *local_278;
  RTCFilterFunctionNArguments local_270;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar10 = context->scene;
  uVar29 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar11->time_range).lower;
  fVar1 = pGVar11->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar11->time_range).upper - fVar1));
  auVar38 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar38 = vminss_avx(auVar38,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar14 = vmaxss_avx(ZEXT816(0) << 0x20,auVar38);
  iVar30 = (int)auVar14._0_4_;
  lVar33 = *(long *)&pGVar11[2].numPrimitives;
  lVar34 = (long)iVar30 * 0x38;
  lVar12 = *(long *)(lVar33 + 0x10 + lVar34);
  lVar32 = *(long *)(lVar33 + lVar34);
  auVar38 = *(undefined1 (*) [16])(lVar32 + lVar12 * uVar29);
  uVar31 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar48 = *(undefined1 (*) [16])(lVar32 + lVar12 * uVar31);
  uVar36 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar39 = *(undefined1 (*) [16])(lVar32 + lVar12 * uVar36);
  uVar35 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar45 = *(undefined1 (*) [16])(lVar32 + lVar12 * uVar35);
  p_Var13 = pGVar11[2].intersectionFilterN;
  lVar12 = *(long *)(p_Var13 + lVar34);
  lVar32 = *(long *)(p_Var13 + lVar34 + 0x10);
  auVar46 = *(undefined1 (*) [16])(lVar12 + lVar32 * uVar29);
  auVar40 = *(undefined1 (*) [16])(lVar12 + lVar32 * uVar31);
  auVar41 = *(undefined1 (*) [16])(lVar12 + lVar32 * uVar36);
  auVar50 = *(undefined1 (*) [16])(lVar12 + lVar32 * uVar35);
  lVar32 = (long)(iVar30 + 1) * 0x38;
  lVar12 = *(long *)(lVar33 + lVar32);
  lVar33 = *(long *)(lVar33 + 0x10 + lVar32);
  auVar52 = *(undefined1 (*) [16])(lVar12 + lVar33 * uVar29);
  auVar57 = *(undefined1 (*) [16])(lVar12 + lVar33 * uVar31);
  auVar58 = *(undefined1 (*) [16])(lVar12 + lVar33 * uVar36);
  auVar65 = *(undefined1 (*) [16])(lVar12 + lVar33 * uVar35);
  lVar33 = *(long *)(p_Var13 + lVar32);
  lVar12 = *(long *)(p_Var13 + lVar32 + 0x10);
  auVar47 = *(undefined1 (*) [16])(lVar33 + uVar29 * lVar12);
  auVar49 = *(undefined1 (*) [16])(lVar33 + uVar31 * lVar12);
  fVar1 = fVar1 - auVar14._0_4_;
  auVar16 = vunpcklps_avx(auVar38,auVar39);
  auVar14 = vunpckhps_avx(auVar38,auVar39);
  auVar38 = vunpcklps_avx(auVar48,auVar45);
  auVar15 = vunpckhps_avx(auVar48,auVar45);
  auVar17 = vunpcklps_avx(auVar16,auVar38);
  auVar39 = vunpckhps_avx(auVar16,auVar38);
  auVar16 = vunpcklps_avx(auVar46,auVar41);
  auVar48 = vunpckhps_avx(auVar46,auVar41);
  auVar46 = vunpcklps_avx(auVar40,auVar50);
  auVar45 = vunpckhps_avx(auVar40,auVar50);
  auVar38 = *(undefined1 (*) [16])(lVar33 + uVar36 * lVar12);
  auVar18 = vunpcklps_avx(auVar48,auVar45);
  auVar19 = vunpcklps_avx(auVar16,auVar46);
  auVar45 = vunpckhps_avx(auVar16,auVar46);
  auVar48 = vunpcklps_avx(auVar52,auVar58);
  auVar40 = vunpckhps_avx(auVar52,auVar58);
  auVar46 = vunpcklps_avx(auVar57,auVar65);
  auVar41 = vunpckhps_avx(auVar57,auVar65);
  auVar52 = vunpcklps_avx(auVar48,auVar46);
  auVar46 = vunpckhps_avx(auVar48,auVar46);
  auVar50 = vunpcklps_avx(auVar47,auVar38);
  auVar48 = vunpckhps_avx(auVar47,auVar38);
  auVar38 = *(undefined1 (*) [16])(lVar33 + lVar12 * uVar35);
  auVar57 = vunpcklps_avx(auVar49,auVar38);
  auVar38 = vunpckhps_avx(auVar49,auVar38);
  auVar58 = vunpcklps_avx(auVar48,auVar38);
  auVar65 = vunpcklps_avx(auVar50,auVar57);
  auVar50 = vunpckhps_avx(auVar50,auVar57);
  auVar38 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar48 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  fVar60 = auVar38._0_4_;
  fVar62 = auVar38._4_4_;
  fVar63 = auVar38._8_4_;
  fVar64 = auVar38._12_4_;
  fVar51 = auVar48._0_4_;
  fVar54 = auVar48._4_4_;
  fVar55 = auVar48._8_4_;
  fVar56 = auVar48._12_4_;
  local_200._0_4_ = fVar60 * auVar52._0_4_ + fVar51 * auVar17._0_4_;
  local_200._4_4_ = fVar62 * auVar52._4_4_ + fVar54 * auVar17._4_4_;
  local_200._8_4_ = fVar63 * auVar52._8_4_ + fVar55 * auVar17._8_4_;
  local_200._12_4_ = fVar64 * auVar52._12_4_ + fVar56 * auVar17._12_4_;
  local_210._0_4_ = fVar51 * auVar39._0_4_ + fVar60 * auVar46._0_4_;
  local_210._4_4_ = fVar54 * auVar39._4_4_ + fVar62 * auVar46._4_4_;
  local_210._8_4_ = fVar55 * auVar39._8_4_ + fVar63 * auVar46._8_4_;
  local_210._12_4_ = fVar56 * auVar39._12_4_ + fVar64 * auVar46._12_4_;
  local_240 = fVar51 * auVar19._0_4_ + fVar60 * auVar65._0_4_;
  fStack_23c = fVar54 * auVar19._4_4_ + fVar62 * auVar65._4_4_;
  fStack_238 = fVar55 * auVar19._8_4_ + fVar63 * auVar65._8_4_;
  fStack_234 = fVar56 * auVar19._12_4_ + fVar64 * auVar65._12_4_;
  local_2d0 = auVar45._0_4_;
  fStack_2cc = auVar45._4_4_;
  fStack_2c8 = auVar45._8_4_;
  fStack_2c4 = auVar45._12_4_;
  local_220 = fVar51 * local_2d0 + fVar60 * auVar50._0_4_;
  fStack_21c = fVar54 * fStack_2cc + fVar62 * auVar50._4_4_;
  fStack_218 = fVar55 * fStack_2c8 + fVar63 * auVar50._8_4_;
  fStack_214 = fVar56 * fStack_2c4 + fVar64 * auVar50._12_4_;
  local_2a0._0_4_ = auVar18._0_4_;
  local_2a0._4_4_ = auVar18._4_4_;
  fStack_298 = auVar18._8_4_;
  fStack_294 = auVar18._12_4_;
  local_230 = fVar51 * (float)local_2a0._0_4_ + fVar60 * auVar58._0_4_;
  fStack_22c = fVar54 * (float)local_2a0._4_4_ + fVar62 * auVar58._4_4_;
  fStack_228 = fVar55 * fStack_298 + fVar63 * auVar58._8_4_;
  fStack_224 = fVar56 * fStack_294 + fVar64 * auVar58._12_4_;
  local_1f0 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar38._0_4_ = fVar1 * local_240 + local_220 * fVar2 + local_230 * fVar3;
  auVar38._4_4_ = fVar1 * fStack_23c + fStack_21c * fVar2 + fStack_22c * fVar3;
  auVar38._8_4_ = fVar1 * fStack_238 + fStack_218 * fVar2 + fStack_228 * fVar3;
  auVar38._12_4_ = fVar1 * fStack_234 + fStack_214 * fVar2 + fStack_224 * fVar3;
  auVar48 = vcmpps_avx(auVar38,ZEXT416(0) << 0x20,4);
  auVar45._8_4_ = 0x3f800000;
  auVar45._0_8_ = &DAT_3f8000003f800000;
  auVar45._12_4_ = 0x3f800000;
  auVar38 = vblendvps_avx(auVar45,auVar38,auVar48);
  auVar39 = vunpcklps_avx(auVar40,auVar41);
  auVar45 = vunpcklps_avx(auVar14,auVar15);
  auVar65._0_4_ = fVar51 * auVar45._0_4_ + fVar60 * auVar39._0_4_;
  auVar65._4_4_ = fVar54 * auVar45._4_4_ + fVar62 * auVar39._4_4_;
  auVar65._8_4_ = fVar55 * auVar45._8_4_ + fVar63 * auVar39._8_4_;
  auVar65._12_4_ = fVar56 * auVar45._12_4_ + fVar64 * auVar39._12_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x40);
  auVar39._4_4_ = fVar4;
  auVar39._0_4_ = fVar4;
  auVar39._8_4_ = fVar4;
  auVar39._12_4_ = fVar4;
  auVar39 = vsubps_avx(auVar65,auVar39);
  fVar5 = *(float *)(ray + k * 4 + 0x20);
  auVar46._4_4_ = fVar5;
  auVar46._0_4_ = fVar5;
  auVar46._8_4_ = fVar5;
  auVar46._12_4_ = fVar5;
  auVar45 = vsubps_avx(local_210,auVar46);
  fVar6 = *(float *)(ray + k * 4);
  auVar50._4_4_ = fVar6;
  auVar50._0_4_ = fVar6;
  auVar50._8_4_ = fVar6;
  auVar50._12_4_ = fVar6;
  auVar46 = vsubps_avx(local_200,auVar50);
  auVar57._0_4_ = auVar46._0_4_ * local_240 + local_220 * auVar45._0_4_ + local_230 * auVar39._0_4_;
  auVar57._4_4_ =
       auVar46._4_4_ * fStack_23c + fStack_21c * auVar45._4_4_ + fStack_22c * auVar39._4_4_;
  auVar57._8_4_ =
       auVar46._8_4_ * fStack_238 + fStack_218 * auVar45._8_4_ + fStack_228 * auVar39._8_4_;
  auVar57._12_4_ =
       auVar46._12_4_ * fStack_234 + fStack_214 * auVar45._12_4_ + fStack_224 * auVar39._12_4_;
  local_1c0 = vdivps_avx(auVar57,auVar38);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar52._4_4_ = uVar7;
  auVar52._0_4_ = uVar7;
  auVar52._8_4_ = uVar7;
  auVar52._12_4_ = uVar7;
  auVar38 = vcmpps_avx(auVar52,local_1c0,2);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar58._4_4_ = uVar7;
  auVar58._0_4_ = uVar7;
  auVar58._8_4_ = uVar7;
  auVar58._12_4_ = uVar7;
  auVar39 = vcmpps_avx(local_1c0,auVar58,2);
  auVar38 = vandps_avx(auVar39,auVar38);
  auVar39 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar39 = vpcmpgtd_avx(auVar39,_DAT_01ff0cf0);
  auVar38 = vandps_avx(auVar39,auVar38);
  auVar39 = auVar48 & auVar38;
  if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0') {
    auVar38 = vandps_avx(auVar38,auVar48);
    auVar48 = vunpckhps_avx(auVar14,auVar15);
    auVar39 = vunpckhps_avx(auVar40,auVar41);
    fVar51 = fVar60 * auVar39._0_4_ + fVar51 * auVar48._0_4_;
    fVar54 = fVar62 * auVar39._4_4_ + fVar54 * auVar48._4_4_;
    fVar55 = fVar63 * auVar39._8_4_ + fVar55 * auVar48._8_4_;
    fVar56 = fVar64 * auVar39._12_4_ + fVar56 * auVar48._12_4_;
    fVar60 = local_1c0._0_4_;
    fVar62 = local_1c0._4_4_;
    fVar63 = local_1c0._8_4_;
    fVar64 = local_1c0._12_4_;
    auVar49._0_4_ = fVar1 * fVar60 + fVar6;
    auVar49._4_4_ = fVar1 * fVar62 + fVar6;
    auVar49._8_4_ = fVar1 * fVar63 + fVar6;
    auVar49._12_4_ = fVar1 * fVar64 + fVar6;
    auVar47._0_4_ = fVar2 * fVar60 + fVar5;
    auVar47._4_4_ = fVar2 * fVar62 + fVar5;
    auVar47._8_4_ = fVar2 * fVar63 + fVar5;
    auVar47._12_4_ = fVar2 * fVar64 + fVar5;
    auVar40._0_4_ = fVar60 * fVar3 + fVar4;
    auVar40._4_4_ = fVar62 * fVar3 + fVar4;
    auVar40._8_4_ = fVar63 * fVar3 + fVar4;
    auVar40._12_4_ = fVar64 * fVar3 + fVar4;
    auVar48 = vsubps_avx(auVar49,local_200);
    auVar39 = vsubps_avx(auVar47,local_210);
    auVar45 = vsubps_avx(auVar40,auVar65);
    auVar41._0_4_ =
         auVar48._0_4_ * auVar48._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar45._0_4_ * auVar45._0_4_;
    auVar41._4_4_ =
         auVar48._4_4_ * auVar48._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar45._4_4_ * auVar45._4_4_;
    auVar41._8_4_ =
         auVar48._8_4_ * auVar48._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar45._8_4_ * auVar45._8_4_;
    auVar41._12_4_ =
         auVar48._12_4_ * auVar48._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar45._12_4_ * auVar45._12_4_;
    auVar48._0_4_ = fVar51 * fVar51;
    auVar48._4_4_ = fVar54 * fVar54;
    auVar48._8_4_ = fVar55 * fVar55;
    auVar48._12_4_ = fVar56 * fVar56;
    auVar48 = vcmpps_avx(auVar41,auVar48,1);
    auVar38 = vandps_avx(auVar48,auVar38);
    uVar28 = vmovmskps_avx(auVar38);
    if (uVar28 != 0) {
      auVar53 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_1e0 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_1b0 = CONCAT44(fStack_23c,local_240);
      uStack_1a8 = CONCAT44(fStack_234,fStack_238);
      local_1a0 = CONCAT44(fStack_21c,local_220);
      uStack_198 = CONCAT44(fStack_214,fStack_218);
      local_190 = CONCAT44(fStack_22c,local_230);
      uStack_188 = CONCAT44(fStack_224,fStack_228);
      uVar36 = (ulong)(uVar28 & 0xff);
      uVar28 = 1 << ((byte)k & 0x1f);
      uVar29 = (ulong)((uVar28 & 0xf) << 4);
      lVar33 = (long)((int)uVar28 >> 4) * 0x10;
      auVar59 = ZEXT464(0) << 0x20;
      auVar61 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_278 = Disc;
      do {
        local_270.hit = local_180;
        local_270.valid = (int *)&local_2c0;
        uVar31 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar28 = *(uint *)(local_1f0 + uVar31 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar28].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar36 = uVar36 ^ 1L << (uVar31 & 0x3f);
          bVar37 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar37 = false;
        }
        else {
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_120 = *(undefined4 *)(local_1e0 + uVar31 * 4);
          local_100 = *(undefined4 *)(local_1e0 + uVar31 * 4 + 0x10);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar31 * 4);
          local_270.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar28),0);
          uVar28 = (local_278->primIDs).field_0.i[uVar31];
          local_e0._4_4_ = uVar28;
          local_e0._0_4_ = uVar28;
          local_e0._8_4_ = uVar28;
          local_e0._12_4_ = uVar28;
          local_e0._16_4_ = uVar28;
          local_e0._20_4_ = uVar28;
          local_e0._24_4_ = uVar28;
          local_e0._28_4_ = uVar28;
          uVar8 = *(undefined4 *)((long)&local_1b0 + uVar31 * 4);
          uVar9 = *(undefined4 *)((long)&local_1a0 + uVar31 * 4);
          local_160._4_4_ = uVar9;
          local_160._0_4_ = uVar9;
          local_160._8_4_ = uVar9;
          local_160._12_4_ = uVar9;
          local_160._16_4_ = uVar9;
          local_160._20_4_ = uVar9;
          local_160._24_4_ = uVar9;
          local_160._28_4_ = uVar9;
          uVar9 = *(undefined4 *)((long)&local_190 + uVar31 * 4);
          local_140._4_4_ = uVar9;
          local_140._0_4_ = uVar9;
          local_140._8_4_ = uVar9;
          local_140._12_4_ = uVar9;
          local_140._16_4_ = uVar9;
          local_140._20_4_ = uVar9;
          local_140._24_4_ = uVar9;
          local_140._28_4_ = uVar9;
          local_180[0] = (RTCHitN)(char)uVar8;
          local_180[1] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar8;
          local_180[5] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar8;
          local_180[9] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar8;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar8;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar8;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar8;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar8;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          local_c0 = local_b0;
          _local_2a0 = vcmpps_avx(auVar53._0_32_,auVar53._0_32_,0xf);
          uStack_9c = (local_270.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_270.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2c0 = *(undefined8 *)(mm_lookupmask_ps + uVar29);
          uStack_2b8 = *(undefined8 *)(mm_lookupmask_ps + uVar29 + 8);
          local_2b0 = *(undefined8 *)(mm_lookupmask_ps + lVar33);
          uStack_2a8 = *(undefined8 *)(mm_lookupmask_ps + lVar33 + 8);
          local_270.geometryUserPtr = pGVar11->userPtr;
          local_270.N = 8;
          local_270.ray = (RTCRayN *)ray;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar11->occlusionFilterN)(&local_270);
            auVar61 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar14._8_8_ = uStack_2b8;
          auVar14._0_8_ = local_2c0;
          auVar38 = vpcmpeqd_avx(auVar59._0_16_,auVar14);
          auVar15._8_8_ = uStack_2a8;
          auVar15._0_8_ = local_2b0;
          auVar48 = vpcmpeqd_avx(auVar59._0_16_,auVar15);
          auVar42._16_16_ = auVar48;
          auVar42._0_16_ = auVar38;
          auVar42 = _local_2a0 & ~auVar42;
          if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar42 >> 0x7f,0) == '\0') &&
                (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar42 >> 0xbf,0) == '\0') &&
              (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar42[0x1f]) {
            auVar43._0_4_ = auVar38._0_4_ ^ local_2a0._0_4_;
            auVar43._4_4_ = auVar38._4_4_ ^ local_2a0._4_4_;
            auVar43._8_4_ = auVar38._8_4_ ^ local_2a0._8_4_;
            auVar43._12_4_ = auVar38._12_4_ ^ local_2a0._12_4_;
            auVar43._16_4_ = auVar48._0_4_ ^ local_2a0._16_4_;
            auVar43._20_4_ = auVar48._4_4_ ^ local_2a0._20_4_;
            auVar43._24_4_ = auVar48._8_4_ ^ local_2a0._24_4_;
            auVar43._28_4_ = auVar48._12_4_ ^ local_2a0._28_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_270);
              auVar61 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar16._8_8_ = uStack_2b8;
            auVar16._0_8_ = local_2c0;
            auVar38 = vpcmpeqd_avx(auVar59._0_16_,auVar16);
            auVar17._8_8_ = uStack_2a8;
            auVar17._0_8_ = local_2b0;
            auVar48 = vpcmpeqd_avx(auVar59._0_16_,auVar17);
            auVar44._16_16_ = auVar48;
            auVar44._0_16_ = auVar38;
            auVar43._0_4_ = auVar38._0_4_ ^ local_2a0._0_4_;
            auVar43._4_4_ = auVar38._4_4_ ^ local_2a0._4_4_;
            auVar43._8_4_ = auVar38._8_4_ ^ local_2a0._8_4_;
            auVar43._12_4_ = auVar38._12_4_ ^ local_2a0._12_4_;
            auVar43._16_4_ = auVar48._0_4_ ^ local_2a0._16_4_;
            auVar43._20_4_ = auVar48._4_4_ ^ local_2a0._20_4_;
            auVar43._24_4_ = auVar48._8_4_ ^ local_2a0._24_4_;
            auVar43._28_4_ = auVar48._12_4_ ^ local_2a0._28_4_;
            auVar42 = vblendvps_avx(auVar61._0_32_,*(undefined1 (*) [32])(local_270.ray + 0x100),
                                    auVar44);
            *(undefined1 (*) [32])(local_270.ray + 0x100) = auVar42;
          }
          bVar26 = (auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar27 = (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar25 = (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar24 = SUB321(auVar43 >> 0x7f,0) == '\0';
          bVar23 = (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar22 = SUB321(auVar43 >> 0xbf,0) == '\0';
          bVar21 = (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar20 = -1 < auVar43[0x1f];
          bVar37 = ((((((bVar26 && bVar27) && bVar25) && bVar24) && bVar23) && bVar22) && bVar21) &&
                   bVar20;
          if (((((((bVar26 && bVar27) && bVar25) && bVar24) && bVar23) && bVar22) && bVar21) &&
              bVar20) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            uVar36 = uVar36 ^ 1L << (uVar31 & 0x3f);
          }
        }
      } while ((bVar37 != false) && (uVar36 != 0));
      return (bool)(bVar37 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }